

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_option(App *this,string *name,callback_t *callback,string *description,bool defaulted)

{
  pointer pcVar1;
  iterator __position;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var2;
  Option *pOVar3;
  OptionAlreadyAdded *this_00;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar4;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_01;
  Option myopt;
  string local_2e8;
  string local_2c8;
  callback_t *local_2a8;
  string local_2a0;
  string local_280;
  _Any_data local_260;
  code *local_250;
  _Any_data local_240;
  code *local_230;
  string local_220;
  Option local_200;
  
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (description->_M_dataplus)._M_p;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar1,pcVar1 + description->_M_string_length);
  local_2a8 = callback;
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_240,callback);
  Option::Option(&local_200,&local_2c8,&local_280,
                 (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                  *)&local_240,defaulted,this);
  if (local_230 != (code *)0x0) {
    (*local_230)(&local_240,&local_240,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  _Var2 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>,std::__cxx11::string,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_200);
  __position._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->options_).
        super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ::_M_realloc_insert<>(&this->options_,__position);
      puVar4 = (this->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl = (Option *)0x0;
      puVar4 = __position._M_current + 1;
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
    pOVar3 = (Option *)operator_new(0x1d0);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,pcVar1,pcVar1 + name->_M_string_length);
    pcVar1 = (description->_M_dataplus)._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar1,pcVar1 + description->_M_string_length);
    std::
    function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)&local_260,local_2a8);
    Option::Option(pOVar3,&local_2e8,&local_2a0,
                   (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                    *)&local_260,defaulted,this);
    this_01 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar4 + -1);
    std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_01,pOVar3);
    if (local_250 != (code *)0x0) {
      (*local_250)(&local_260,&local_260,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
              (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
               (this_01->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    pOVar3 = (this_01->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    Option::~Option(&local_200);
    return pOVar3;
  }
  this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
  Option::get_name_abi_cxx11_(&local_220,&local_200,false,false);
  OptionAlreadyAdded::OptionAlreadyAdded(this_00,&local_220);
  __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,Error::~Error);
}

Assistant:

Option *add_option(std::string name, callback_t callback, std::string description = "", bool defaulted = false) {
        Option myopt{name, description, callback, defaulted, this};

        if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) {
               return *v == myopt;
           }) == std::end(options_)) {
            options_.emplace_back();
            Option_p &option = options_.back();
            option.reset(new Option(name, description, callback, defaulted, this));
            option_defaults_.copy_to(option.get());
            return option.get();
        } else
            throw OptionAlreadyAdded(myopt.get_name());
    }